

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmMakefileTargetGenerator::WriteObjectsStrings
          (cmMakefileTargetGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *objStrings,size_type limit)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmLocalUnixMakefileGenerator3 *this_00;
  cmOutputConverter *pcVar3;
  pointer pbVar4;
  cmMakefileTargetGeneratorObjectStrings local_d0;
  cmStateSnapshot local_48;
  
  this_00 = this->LocalGenerator;
  pcVar3 = &(this_00->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  if (this_00 == (cmLocalUnixMakefileGenerator3 *)0x0) {
    pcVar3 = (cmOutputConverter *)0x0;
  }
  cmLocalGenerator::GetStateSnapshot(&local_48,(cmLocalGenerator *)this_00);
  cmStateSnapshot::GetDirectory(&local_d0.StateDir,&local_48);
  paVar1 = &local_d0.CurrentString.field_2;
  local_d0.CurrentString._M_string_length = 0;
  local_d0.CurrentString.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_d0.NextObject.field_2;
  local_d0.NextObject._M_string_length = 0;
  local_d0.NextObject.field_2._M_local_buf[0] = '\0';
  local_d0.Space = "";
  pbVar4 = (this->Objects).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_d0.Strings = objStrings;
  local_d0.OutputConverter = pcVar3;
  local_d0.LengthLimit = limit;
  local_d0.CurrentString._M_dataplus._M_p = (pointer)paVar1;
  local_d0.NextObject._M_dataplus._M_p = (pointer)paVar2;
  if (pbVar4 != (this->Objects).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      cmMakefileTargetGeneratorObjectStrings::Feed(&local_d0,pbVar4);
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != (this->Objects).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  pbVar4 = (this->ExternalObjects).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar4 != (this->ExternalObjects).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      cmMakefileTargetGeneratorObjectStrings::Feed(&local_d0,pbVar4);
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != (this->ExternalObjects).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_d0.Strings,&local_d0.CurrentString);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.NextObject._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0.NextObject._M_dataplus._M_p,
                    CONCAT71(local_d0.NextObject.field_2._M_allocated_capacity._1_7_,
                             local_d0.NextObject.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.CurrentString._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.CurrentString._M_dataplus._M_p,
                    CONCAT71(local_d0.CurrentString.field_2._M_allocated_capacity._1_7_,
                             local_d0.CurrentString.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteObjectsStrings(
  std::vector<std::string>& objStrings, std::string::size_type limit)
{
  cmMakefileTargetGeneratorObjectStrings helper(
    objStrings, this->LocalGenerator,
    this->LocalGenerator->GetStateSnapshot().GetDirectory(), limit);
  for (std::vector<std::string>::const_iterator i = this->Objects.begin();
       i != this->Objects.end(); ++i) {
    helper.Feed(*i);
  }
  for (std::vector<std::string>::const_iterator i =
         this->ExternalObjects.begin();
       i != this->ExternalObjects.end(); ++i) {
    helper.Feed(*i);
  }
  helper.Done();
}